

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O1

uint32_t * pack27_16(uint32_t base,uint32_t *in,uint32_t *out)

{
  uint32_t uVar1;
  uint uVar2;
  
  uVar1 = *in;
  *out = uVar1 - base;
  *out = (in[1] - base) * 0x8000000 | uVar1 - base;
  uVar2 = in[1] - base >> 5;
  out[1] = uVar2;
  out[1] = (in[2] - base) * 0x400000 | uVar2;
  uVar2 = in[2] - base >> 10;
  out[2] = uVar2;
  out[2] = (in[3] - base) * 0x20000 | uVar2;
  uVar2 = in[3] - base >> 0xf;
  out[3] = uVar2;
  out[3] = (in[4] - base) * 0x1000 | uVar2;
  uVar2 = in[4] - base >> 0x14;
  out[4] = uVar2;
  out[4] = (in[5] - base) * 0x80 | uVar2;
  uVar2 = in[5] - base >> 0x19;
  out[5] = uVar2;
  uVar2 = (in[6] - base) * 4 | uVar2;
  out[5] = uVar2;
  out[5] = (in[7] - base) * 0x20000000 | uVar2;
  uVar2 = in[7] - base >> 3;
  out[6] = uVar2;
  out[6] = (in[8] - base) * 0x1000000 | uVar2;
  uVar2 = in[8] - base >> 8;
  out[7] = uVar2;
  out[7] = (in[9] - base) * 0x80000 | uVar2;
  uVar2 = in[9] - base >> 0xd;
  out[8] = uVar2;
  out[8] = (in[10] - base) * 0x4000 | uVar2;
  uVar2 = in[10] - base >> 0x12;
  out[9] = uVar2;
  out[9] = (in[0xb] - base) * 0x200 | uVar2;
  uVar2 = in[0xb] - base >> 0x17;
  out[10] = uVar2;
  uVar2 = (in[0xc] - base) * 0x10 | uVar2;
  out[10] = uVar2;
  out[10] = (in[0xd] - base) * -0x80000000 | uVar2;
  uVar2 = in[0xd] - base >> 1;
  out[0xb] = uVar2;
  out[0xb] = (in[0xe] - base) * 0x4000000 | uVar2;
  uVar2 = in[0xe] - base >> 6;
  out[0xc] = uVar2;
  out[0xc] = (in[0xf] - base) * 0x200000 | uVar2;
  out[0xd] = in[0xf] - base >> 0xb;
  return out + 0xe;
}

Assistant:

uint32_t * pack27_16( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out =  static_cast<uint32_t>((*in) -base)  ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  27 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 27  -  22 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  22 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 27  -  17 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  17 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 27  -  12 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  12 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 27  -  7 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  7 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 27  -  2 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  2 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  29 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 27  -  24 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  24 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 27  -  19 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  19 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 27  -  14 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  14 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 27  -  9 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  9 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 27  -  4 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  4 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  31 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 27  -  26 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  26 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 27  -  21 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  21 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 27  -  16 );
    ++in;

    return out + 1;
}